

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:553:55)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:553:55)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  uint32_t uVar1;
  value *v;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  uint32_t index;
  anon_class_16_1_570cf4e1_for_f *this_00;
  anon_union_32_5_7b1e0779_for_value_3 *this_01;
  wstring idx_str;
  wstring local_90;
  wchar_t *local_70;
  anon_union_32_5_7b1e0779_for_value_3 local_68;
  gc_heap_ptr_untyped local_48;
  
  this_00 = &this->f;
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc8,v);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc8);
  if (this_->type_ == object) {
    this_01 = &this_->field_1;
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
    local_90._M_dataplus._M_p = (pointer)0x6;
    local_90._M_string_length = 0x193338;
    (**(code **)*puVar2)((value *)&local_70,puVar2);
    uVar1 = to_uint32((value *)&local_70);
    value::destroy((value *)&local_70);
    if (uVar1 == 0) {
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
      plVar4 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
      (**(code **)(*plVar4 + 0x98))(&local_90,plVar4,"length");
      local_70 = (wchar_t *)CONCAT44(local_70._4_4_,number);
      local_68.n_ = 0.0;
      (**(code **)(*plVar3 + 8))(plVar3,&local_90,&local_70,0);
      value::destroy((value *)&local_70);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90);
      value::value(__return_storage_ptr__,(value *)&value::undefined);
    }
    else {
      index_string_abi_cxx11_(&local_90,(mjs *)(ulong)(uVar1 - 1),index);
      puVar2 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
      local_70 = (wchar_t *)local_90._M_string_length;
      local_68.n_ = (double)local_90._M_dataplus._M_p;
      (**(code **)*puVar2)(__return_storage_ptr__,puVar2);
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
      local_70 = (wchar_t *)local_90._M_string_length;
      local_68.n_ = (double)local_90._M_dataplus._M_p;
      (**(code **)(*plVar3 + 0x10))(plVar3);
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
      plVar4 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
      (**(code **)(*plVar4 + 0x98))(&local_48,plVar4,"length");
      local_68.n_ = (double)(uVar1 - 1);
      local_70 = (wchar_t *)CONCAT44(local_70._4_4_,number);
      (**(code **)(*plVar3 + 8))(plVar3,&local_48,&local_70,0);
      value::destroy((value *)&local_70);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity * 4 + 4);
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }